

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O3

string * __thiscall
common::matrix_to_string_abi_cxx11_(string *__return_storage_ptr__,common *this,Matrix<double> *m)

{
  bool bVar1;
  double *pdVar2;
  size_t col;
  ulong uVar3;
  size_t row;
  string e_string_int;
  string e_string;
  long *local_78 [2];
  long local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (*(long *)this != 0) {
    row = 0;
    do {
      if (*(long *)(this + 8) != 0) {
        col = 0;
        uVar3 = 1;
        do {
          pdVar2 = data_structures::Matrix<double>::read_at((Matrix<double> *)this,row,col);
          if (*pdVar2 < INFINITY) {
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f");
            std::__cxx11::string::find((char *)&local_50,0x123300,0);
            std::__cxx11::string::substr((ulong)local_78,(ulong)&local_50);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
            if (local_78[0] != local_68) {
              operator_delete(local_78[0],local_68[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          bVar1 = uVar3 < *(ulong *)(this + 8);
          col = uVar3;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (bVar1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      row = (size_t)((int)row + 1);
    } while (row < *(ulong *)this);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

const std::string matrix_to_string(const data_structures::Matrix<double>& m) {
  std::string s("");
  for (unsigned int x = 0; x < m.get_rows(); ++x){
    for (unsigned int y = 0; y < m.get_columns(); ++y){
      double e = m.read_at(x, y);
      if (e == std::numeric_limits<double>::infinity()) {
        s += "@";
      } else {
        std::string e_string = std::to_string(e);
        std::string e_string_int = e_string.substr(0, e_string.find("."));
        s += e_string_int;
      }
    }
    s += "\n";
  }
  s.pop_back();
  return s;
}